

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printError<std::__cxx11::wstring,unsigned_short>
               (ErrorType type,wchar_t *text,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args,
               unsigned_short *args_1)

{
  wstring local_48 [8];
  wstring message;
  unsigned_short *args_local_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_local;
  wchar_t *text_local;
  ErrorType type_local;
  
  formatString<std::__cxx11::wstring,unsigned_short>
            ((wchar_t *)local_48,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)text,
             (unsigned_short *)args);
  printError(type,local_48);
  std::__cxx11::wstring::~wstring((wstring *)local_48);
  return;
}

Assistant:

static void printError(ErrorType type, const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		printError(type,message);
	}